

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBufferTests.cpp
# Opt level: O3

TestCaseGroup * deqp::gles31::Functional::createTextureBufferTests(Context *context)

{
  RenderBits RVar1;
  ModifyBits MVar2;
  size_t sVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  TestCaseGroup *this;
  TestNode *pTVar6;
  TestNode *pTVar7;
  long *plVar8;
  TextureBufferCase *pTVar9;
  size_type *psVar10;
  long *plVar11;
  RenderBits renderBits;
  RenderBits renderBits_00;
  ModifyBits modifyBits;
  ModifyBits modifyBits_00;
  ModifyBits modifyBits_01;
  ModifyBits modifyBits_02;
  RenderBits renderBits_01;
  RenderBits renderBits_02;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar12;
  int sizeNdx_1;
  int renderTypeNdx;
  long lVar13;
  bool bVar14;
  int sizeNdx;
  long lVar15;
  string name;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  TestNode *local_258;
  TestCaseGroup *local_250;
  TestNode *local_248;
  long *local_240 [2];
  long local_230 [2];
  ostringstream s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [6];
  ios_base local_1b0 [264];
  size_t local_a8 [6];
  RenderBits local_78 [18];
  
  this = (TestCaseGroup *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,context->m_testCtx,"texture_buffer",
             "Texture buffer syncronization tests");
  (this->super_TestCaseGroup).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
  this->m_context = context;
  local_a8[0] = 0x200;
  local_a8[1] = 0x201;
  local_a8[2] = 0x10000;
  local_a8[3] = 0x10001;
  local_a8[4] = 0x1ffff;
  local_78[0] = RENDERBITS_AS_VERTEX_ARRAY;
  local_78[1] = RENDERBITS_AS_INDEX_ARRAY;
  local_78[2] = RENDERBITS_AS_INDEX_ARRAY|RENDERBITS_AS_VERTEX_ARRAY;
  local_78[3] = RENDERBITS_AS_VERTEX_TEXTURE;
  local_78[4] = RENDERBITS_AS_VERTEX_TEXTURE|RENDERBITS_AS_VERTEX_ARRAY;
  local_78[5] = RENDERBITS_AS_VERTEX_TEXTURE|RENDERBITS_AS_INDEX_ARRAY;
  local_78[6] = RENDERBITS_AS_VERTEX_TEXTURE|RENDERBITS_AS_INDEX_ARRAY|RENDERBITS_AS_VERTEX_ARRAY;
  local_78[7] = RENDERBITS_AS_FRAGMENT_TEXTURE;
  local_78[8] = RENDERBITS_AS_FRAGMENT_TEXTURE|RENDERBITS_AS_VERTEX_ARRAY;
  local_78[9] = RENDERBITS_AS_FRAGMENT_TEXTURE|RENDERBITS_AS_INDEX_ARRAY;
  local_78[10] = RENDERBITS_AS_FRAGMENT_TEXTURE|RENDERBITS_AS_INDEX_ARRAY|RENDERBITS_AS_VERTEX_ARRAY
  ;
  local_78[0xb] = RENDERBITS_AS_FRAGMENT_TEXTURE|RENDERBITS_AS_VERTEX_TEXTURE;
  local_78[0xc] =
       RENDERBITS_AS_FRAGMENT_TEXTURE|RENDERBITS_AS_VERTEX_TEXTURE|RENDERBITS_AS_VERTEX_ARRAY;
  local_78[0xd] =
       RENDERBITS_AS_FRAGMENT_TEXTURE|RENDERBITS_AS_VERTEX_TEXTURE|RENDERBITS_AS_INDEX_ARRAY;
  local_78[0xe] = 0xf;
  pTVar6 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,context->m_testCtx,"state_query","Query states and limits");
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar7 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"max_texture_buffer_size_getboolean",
             "Test MAX_TEXTURE_BUFFER_SIZE");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39de0;
  pTVar7[1].m_testCtx = (TestContext *)0x1000000008c2b;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"max_texture_buffer_size_getinteger",
             "Test MAX_TEXTURE_BUFFER_SIZE");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39de0;
  pTVar7[1].m_testCtx = (TestContext *)0x1000000008c2b;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 3;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"max_texture_buffer_size_getinteger64",
             "Test MAX_TEXTURE_BUFFER_SIZE");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39de0;
  pTVar7[1].m_testCtx = (TestContext *)0x1000000008c2b;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 4;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"max_texture_buffer_size_getfloat",
             "Test MAX_TEXTURE_BUFFER_SIZE");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39de0;
  pTVar7[1].m_testCtx = (TestContext *)0x1000000008c2b;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 5;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"texture_buffer_offset_alignment_getboolean",
             "Test TEXTURE_BUFFER_OFFSET_ALIGNMENT");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39e30;
  pTVar7[1].m_testCtx = (TestContext *)0x1000000919f;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"texture_buffer_offset_alignment_getinteger",
             "Test TEXTURE_BUFFER_OFFSET_ALIGNMENT");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39e30;
  pTVar7[1].m_testCtx = (TestContext *)0x1000000919f;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 3;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"texture_buffer_offset_alignment_getinteger64",
             "Test TEXTURE_BUFFER_OFFSET_ALIGNMENT");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39e30;
  pTVar7[1].m_testCtx = (TestContext *)0x1000000919f;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 4;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"texture_buffer_offset_alignment_getfloat",
             "Test TEXTURE_BUFFER_OFFSET_ALIGNMENT");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39e30;
  pTVar7[1].m_testCtx = (TestContext *)0x1000000919f;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 5;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"texture_buffer_binding_getboolean",
             "TEXTURE_BUFFER_BINDING");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39e80;
  *(undefined4 *)&pTVar7[1].m_testCtx = 0;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"texture_buffer_binding_getinteger",
             "TEXTURE_BUFFER_BINDING");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39e80;
  *(undefined4 *)&pTVar7[1].m_testCtx = 3;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"texture_buffer_binding_getinteger64",
             "TEXTURE_BUFFER_BINDING");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39e80;
  *(undefined4 *)&pTVar7[1].m_testCtx = 4;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"texture_buffer_binding_getfloat",
             "TEXTURE_BUFFER_BINDING");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39e80;
  *(undefined4 *)&pTVar7[1].m_testCtx = 5;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"texture_binding_buffer_getboolean",
             "TEXTURE_BINDING_BUFFER");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39ed0;
  *(undefined4 *)&pTVar7[1].m_testCtx = 0;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"texture_binding_buffer_getinteger",
             "TEXTURE_BINDING_BUFFER");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39ed0;
  *(undefined4 *)&pTVar7[1].m_testCtx = 3;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"texture_binding_buffer_getinteger64",
             "TEXTURE_BINDING_BUFFER");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39ed0;
  *(undefined4 *)&pTVar7[1].m_testCtx = 4;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"texture_binding_buffer_getfloat",
             "TEXTURE_BINDING_BUFFER");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39ed0;
  *(undefined4 *)&pTVar7[1].m_testCtx = 5;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"texture_buffer_data_store_binding_integer",
             "TEXTURE_BUFFER_DATA_STORE_BINDING");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39f20;
  *(undefined4 *)&pTVar7[1].m_testCtx = 0x1d;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"texture_buffer_data_store_binding_float",
             "TEXTURE_BUFFER_DATA_STORE_BINDING");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39f20;
  *(undefined4 *)&pTVar7[1].m_testCtx = 0x1e;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"texture_buffer_offset_integer",
             "TEXTURE_BUFFER_OFFSET");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39f70;
  *(undefined4 *)&pTVar7[1].m_testCtx = 0x1d;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"texture_buffer_offset_float",
             "TEXTURE_BUFFER_OFFSET");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39f70;
  *(undefined4 *)&pTVar7[1].m_testCtx = 0x1e;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"texture_buffer_size_integer",
             "TEXTURE_BUFFER_SIZE");
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39fc0;
  *(undefined4 *)&pTVar7[1].m_testCtx = 0x1d;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,context->m_testCtx,"texture_buffer_size_float","TEXTURE_BUFFER_SIZE"
            );
  pTVar7[1]._vptr_TestNode = (_func_int **)context;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b39fc0;
  *(undefined4 *)&pTVar7[1].m_testCtx = 0x1e;
  tcu::TestNode::addChild(pTVar6,pTVar7);
  pTVar6 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,context->m_testCtx,"render",
             "Setup texture buffer with glBufferData and render data in different ways");
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  local_250 = this;
  local_248 = pTVar6;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  lVar15 = 0;
  do {
    RVar1 = local_78[lVar15];
    local_258 = (TestNode *)lVar15;
    pTVar6 = (TestNode *)operator_new(0x78);
    (anonymous_namespace)::toTestName_abi_cxx11_
              ((string *)&s,(_anonymous_namespace_ *)(ulong)RVar1,renderBits);
    _Var4._M_p = _s;
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&name,(_anonymous_namespace_ *)(ulong)RVar1,renderBits_00);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,context->m_testCtx,_Var4._M_p,name._M_dataplus._M_p);
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
    pTVar6[1]._vptr_TestNode = (_func_int **)context;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_s != local_210) {
      operator_delete(_s,local_210[0]._M_allocated_capacity + 1);
    }
    tcu::TestNode::addChild(local_248,pTVar6);
    lVar15 = 0;
    do {
      sVar3 = local_a8[lVar15];
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::ostream::_M_insert<unsigned_long>((ulong)&s);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base(local_1b0);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,0x976539);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar10) {
        name.field_2._M_allocated_capacity = *psVar10;
        name.field_2._8_8_ = plVar8[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar10;
        name._M_dataplus._M_p = (pointer)*plVar8;
      }
      name._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      pTVar9 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar9,context->m_testCtx,context->m_renderCtx,0x8058,sVar3,0,0,RENDERBITS_NONE,
                 MODIFYBITS_NONE,RVar1,name._M_dataplus._M_p,name._M_dataplus._M_p);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 5);
    lVar15 = 0;
    do {
      sVar3 = *(size_t *)((long)&DAT_009a4e00 + lVar15);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::ostream::_M_insert<unsigned_long>((ulong)&s);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base(local_1b0);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,0x9a4b2f);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar10) {
        name.field_2._M_allocated_capacity = *psVar10;
        name.field_2._8_8_ = plVar8[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar10;
        name._M_dataplus._M_p = (pointer)*plVar8;
      }
      name._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      pTVar9 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar9,context->m_testCtx,context->m_renderCtx,0x8058,0x20000,0,sVar3,
                 RENDERBITS_NONE,MODIFYBITS_NONE,RVar1,name._M_dataplus._M_p,name._M_dataplus._M_p);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar15 = lVar15 + 8;
    } while (lVar15 != 0x20);
    lVar15 = 0;
    bVar5 = true;
    do {
      bVar14 = bVar5;
      sVar3 = (&DAT_009a4780)[lVar15];
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::ostream::_M_insert<unsigned_long>((ulong)&s);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base(local_1b0);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_240,0,(char *)0x0,0x9743ea);
      local_278 = &local_268;
      plVar11 = plVar8 + 2;
      if ((long *)*plVar8 == plVar11) {
        local_268 = *plVar11;
        lStack_260 = plVar8[3];
      }
      else {
        local_268 = *plVar11;
        local_278 = (long *)*plVar8;
      }
      local_270 = plVar8[1];
      *plVar8 = (long)plVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_278);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar10) {
        name.field_2._M_allocated_capacity = *psVar10;
        name.field_2._8_8_ = plVar8[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar10;
        name._M_dataplus._M_p = (pointer)*plVar8;
      }
      name._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      if (local_240[0] != local_230) {
        operator_delete(local_240[0],local_230[0] + 1);
      }
      pTVar9 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar9,context->m_testCtx,context->m_renderCtx,0x8058,0x20000,sVar3,0x10001,
                 RENDERBITS_NONE,MODIFYBITS_NONE,RVar1,name._M_dataplus._M_p,name._M_dataplus._M_p);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar15 = 1;
      bVar5 = false;
    } while (bVar14);
    lVar15 = (long)local_258 + 1;
  } while (lVar15 != 0xf);
  pTVar6 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,context->m_testCtx,"modify",
             "Modify texture buffer content in multiple ways");
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)local_250,pTVar6);
  lVar15 = 0;
  local_248 = pTVar6;
  do {
    pTVar6 = local_248;
    MVar2 = (&DAT_009a4790)[lVar15];
    local_258 = (TestNode *)lVar15;
    pTVar7 = (TestNode *)operator_new(0x78);
    (anonymous_namespace)::toTestName_abi_cxx11_
              ((string *)&s,(_anonymous_namespace_ *)(ulong)MVar2,modifyBits);
    _Var4._M_p = _s;
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&name,(_anonymous_namespace_ *)(ulong)MVar2,modifyBits_00);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar7,context->m_testCtx,_Var4._M_p,name._M_dataplus._M_p);
    pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
    pTVar7[1]._vptr_TestNode = (_func_int **)context;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_s != local_210) {
      operator_delete(_s,local_210[0]._M_allocated_capacity + 1);
    }
    tcu::TestNode::addChild(pTVar6,pTVar7);
    lVar15 = 0;
    do {
      sVar3 = local_a8[lVar15];
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::ostream::_M_insert<unsigned_long>((ulong)&s);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base(local_1b0);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,0x976539);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar10) {
        name.field_2._M_allocated_capacity = *psVar10;
        name.field_2._8_8_ = plVar8[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar10;
        name._M_dataplus._M_p = (pointer)*plVar8;
      }
      name._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      pTVar9 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar9,context->m_testCtx,context->m_renderCtx,0x8058,sVar3,0,0,RENDERBITS_NONE,
                 MVar2,RENDERBITS_AS_FRAGMENT_TEXTURE,name._M_dataplus._M_p,name._M_dataplus._M_p);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 5);
    lVar15 = 0;
    do {
      sVar3 = *(size_t *)((long)&DAT_009a4e00 + lVar15);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::ostream::_M_insert<unsigned_long>((ulong)&s);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base(local_1b0);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,0x9a4b2f);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar10) {
        name.field_2._M_allocated_capacity = *psVar10;
        name.field_2._8_8_ = plVar8[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar10;
        name._M_dataplus._M_p = (pointer)*plVar8;
      }
      name._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      pTVar9 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar9,context->m_testCtx,context->m_renderCtx,0x8058,0x20000,0,sVar3,
                 RENDERBITS_NONE,MVar2,RENDERBITS_AS_FRAGMENT_TEXTURE,name._M_dataplus._M_p,
                 name._M_dataplus._M_p);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar15 = lVar15 + 8;
    } while (lVar15 != 0x20);
    lVar15 = 0;
    bVar5 = true;
    do {
      bVar14 = bVar5;
      sVar3 = (&DAT_009a4780)[lVar15];
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::ostream::_M_insert<unsigned_long>((ulong)&s);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base(local_1b0);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_240,0,(char *)0x0,0x9743ea);
      local_278 = &local_268;
      plVar11 = plVar8 + 2;
      if ((long *)*plVar8 == plVar11) {
        local_268 = *plVar11;
        lStack_260 = plVar8[3];
      }
      else {
        local_268 = *plVar11;
        local_278 = (long *)*plVar8;
      }
      local_270 = plVar8[1];
      *plVar8 = (long)plVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_278);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar10) {
        name.field_2._M_allocated_capacity = *psVar10;
        name.field_2._8_8_ = plVar8[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar10;
        name._M_dataplus._M_p = (pointer)*plVar8;
      }
      name._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_278 != &local_268) {
        operator_delete(local_278,local_268 + 1);
      }
      if (local_240[0] != local_230) {
        operator_delete(local_240[0],local_230[0] + 1);
      }
      pTVar9 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar9,context->m_testCtx,context->m_renderCtx,0x8058,0x20000,sVar3,0x10001,
                 RENDERBITS_NONE,MVar2,RENDERBITS_AS_FRAGMENT_TEXTURE,name._M_dataplus._M_p,
                 name._M_dataplus._M_p);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar15 = 1;
      bVar5 = false;
    } while (bVar14);
    lVar15 = (long)local_258 + 1;
  } while (lVar15 != 4);
  pTVar6 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,context->m_testCtx,"modify_render",
             "Modify texture buffer content in multiple ways and render in different ways");
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)local_250,pTVar6);
  lVar15 = 0;
  local_258 = pTVar6;
  do {
    pTVar6 = local_258;
    MVar2 = (&DAT_009a4790)[lVar15];
    pTVar7 = (TestNode *)operator_new(0x78);
    (anonymous_namespace)::toTestName_abi_cxx11_
              ((string *)&s,(_anonymous_namespace_ *)(ulong)MVar2,modifyBits_01);
    _Var4._M_p = _s;
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&name,(_anonymous_namespace_ *)(ulong)MVar2,modifyBits_02);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar7,context->m_testCtx,_Var4._M_p,name._M_dataplus._M_p);
    pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
    pTVar7[1]._vptr_TestNode = (_func_int **)context;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_s != local_210) {
      operator_delete(_s,local_210[0]._M_allocated_capacity + 1);
    }
    tcu::TestNode::addChild(pTVar6,pTVar7);
    lVar13 = 0;
    uVar12 = extraout_RDX;
    do {
      RVar1 = local_78[lVar13];
      (anonymous_namespace)::toTestName_abi_cxx11_
                ((string *)&s,(_anonymous_namespace_ *)(ulong)RVar1,(RenderBits)uVar12);
      pTVar9 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar9,context->m_testCtx,context->m_renderCtx,0x8058,0x4000,0,0,RENDERBITS_NONE,
                 MVar2,RVar1,_s,_s);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar9);
      uVar12 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_s != local_210) {
        operator_delete(_s,local_210[0]._M_allocated_capacity + 1);
        uVar12 = extraout_RDX_01;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0xf);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 4);
  pTVar6 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,context->m_testCtx,"render_modify",
             "Render texture buffer and modify.");
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
  pTVar6[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)local_250,pTVar6);
  lVar15 = 0;
  local_258 = pTVar6;
  do {
    pTVar6 = local_258;
    RVar1 = local_78[lVar15];
    pTVar7 = (TestNode *)operator_new(0x78);
    (anonymous_namespace)::toTestName_abi_cxx11_
              ((string *)&s,(_anonymous_namespace_ *)(ulong)RVar1,renderBits_01);
    _Var4._M_p = _s;
    (anonymous_namespace)::toTestName_abi_cxx11_
              (&name,(_anonymous_namespace_ *)(ulong)RVar1,renderBits_02);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar7,context->m_testCtx,_Var4._M_p,name._M_dataplus._M_p);
    pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
    pTVar7[1]._vptr_TestNode = (_func_int **)context;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_s != local_210) {
      operator_delete(_s,local_210[0]._M_allocated_capacity + 1);
    }
    tcu::TestNode::addChild(pTVar6,pTVar7);
    lVar13 = 0;
    uVar12 = extraout_RDX_02;
    do {
      MVar2 = *(ModifyBits *)((long)&DAT_009a4790 + lVar13);
      (anonymous_namespace)::toTestName_abi_cxx11_
                ((string *)&s,(_anonymous_namespace_ *)(ulong)MVar2,(ModifyBits)uVar12);
      pTVar9 = (TextureBufferCase *)operator_new(0xb8);
      gls::TextureBufferCase::TextureBufferCase
                (pTVar9,context->m_testCtx,context->m_renderCtx,0x8058,0x4000,0,0,RVar1,MVar2,
                 RENDERBITS_AS_FRAGMENT_TEXTURE,_s,_s);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar9);
      uVar12 = extraout_RDX_03;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_s != local_210) {
        operator_delete(_s,local_210[0]._M_allocated_capacity + 1);
        uVar12 = extraout_RDX_04;
      }
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0x10);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0xf);
  return local_250;
}

Assistant:

TestCaseGroup* createTextureBufferTests (Context& context)
{
	TestCaseGroup* const root = new TestCaseGroup(context, "texture_buffer", "Texture buffer syncronization tests");

	const size_t bufferSizes[] =
	{
		512,
		513,
		65536,
		65537,
		131071
	};

	const size_t rangeSizes[] =
	{
		512,
		513,
		65537,
		98304,
	};

	const size_t offsets[] =
	{
		1,
		7
	};

	const RenderBits renderTypeCombinations[] =
	{
		RENDERBITS_AS_VERTEX_ARRAY,
									  RENDERBITS_AS_INDEX_ARRAY,
		RENDERBITS_AS_VERTEX_ARRAY	| RENDERBITS_AS_INDEX_ARRAY,

																  RENDERBITS_AS_VERTEX_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	|							  RENDERBITS_AS_VERTEX_TEXTURE,
									  RENDERBITS_AS_INDEX_ARRAY	| RENDERBITS_AS_VERTEX_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	| RENDERBITS_AS_INDEX_ARRAY	| RENDERBITS_AS_VERTEX_TEXTURE,

																								  RENDERBITS_AS_FRAGMENT_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	|															  RENDERBITS_AS_FRAGMENT_TEXTURE,
									  RENDERBITS_AS_INDEX_ARRAY |								  RENDERBITS_AS_FRAGMENT_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	| RENDERBITS_AS_INDEX_ARRAY |								  RENDERBITS_AS_FRAGMENT_TEXTURE,
																  RENDERBITS_AS_VERTEX_TEXTURE	| RENDERBITS_AS_FRAGMENT_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	|							  RENDERBITS_AS_VERTEX_TEXTURE	| RENDERBITS_AS_FRAGMENT_TEXTURE,
									  RENDERBITS_AS_INDEX_ARRAY	| RENDERBITS_AS_VERTEX_TEXTURE	| RENDERBITS_AS_FRAGMENT_TEXTURE,
		RENDERBITS_AS_VERTEX_ARRAY	| RENDERBITS_AS_INDEX_ARRAY	| RENDERBITS_AS_VERTEX_TEXTURE	| RENDERBITS_AS_FRAGMENT_TEXTURE
	};

	const ModifyBits modifyTypes[] =
	{
		MODIFYBITS_BUFFERDATA,
		MODIFYBITS_BUFFERSUBDATA,
		MODIFYBITS_MAPBUFFER_WRITE,
		MODIFYBITS_MAPBUFFER_READWRITE
	};

	// State and limit queries
	{
		TestCaseGroup* const queryGroup = new TestCaseGroup(context, "state_query", "Query states and limits");
		root->addChild(queryGroup);

		queryGroup->addChild(new LimitQueryCase		(context, "max_texture_buffer_size_getboolean",				"Test MAX_TEXTURE_BUFFER_SIZE",			GL_MAX_TEXTURE_BUFFER_SIZE,			65536,	QUERY_BOOLEAN));
		queryGroup->addChild(new LimitQueryCase		(context, "max_texture_buffer_size_getinteger",				"Test MAX_TEXTURE_BUFFER_SIZE",			GL_MAX_TEXTURE_BUFFER_SIZE,			65536,	QUERY_INTEGER));
		queryGroup->addChild(new LimitQueryCase		(context, "max_texture_buffer_size_getinteger64",			"Test MAX_TEXTURE_BUFFER_SIZE",			GL_MAX_TEXTURE_BUFFER_SIZE,			65536,	QUERY_INTEGER64));
		queryGroup->addChild(new LimitQueryCase		(context, "max_texture_buffer_size_getfloat",				"Test MAX_TEXTURE_BUFFER_SIZE",			GL_MAX_TEXTURE_BUFFER_SIZE,			65536,	QUERY_FLOAT));
		queryGroup->addChild(new AlignmentQueryCase	(context, "texture_buffer_offset_alignment_getboolean",		"Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",	GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT,	256,	QUERY_BOOLEAN));
		queryGroup->addChild(new AlignmentQueryCase	(context, "texture_buffer_offset_alignment_getinteger",		"Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",	GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT,	256,	QUERY_INTEGER));
		queryGroup->addChild(new AlignmentQueryCase	(context, "texture_buffer_offset_alignment_getinteger64",	"Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",	GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT,	256,	QUERY_INTEGER64));
		queryGroup->addChild(new AlignmentQueryCase	(context, "texture_buffer_offset_alignment_getfloat",		"Test TEXTURE_BUFFER_OFFSET_ALIGNMENT",	GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT,	256,	QUERY_FLOAT));

		queryGroup->addChild(new TextureBufferBindingQueryCase(context, "texture_buffer_binding_getboolean",	"TEXTURE_BUFFER_BINDING", QUERY_BOOLEAN));
		queryGroup->addChild(new TextureBufferBindingQueryCase(context, "texture_buffer_binding_getinteger",	"TEXTURE_BUFFER_BINDING", QUERY_INTEGER));
		queryGroup->addChild(new TextureBufferBindingQueryCase(context, "texture_buffer_binding_getinteger64",	"TEXTURE_BUFFER_BINDING", QUERY_INTEGER64));
		queryGroup->addChild(new TextureBufferBindingQueryCase(context, "texture_buffer_binding_getfloat",		"TEXTURE_BUFFER_BINDING", QUERY_FLOAT));

		queryGroup->addChild(new TextureBindingBufferQueryCase(context, "texture_binding_buffer_getboolean",	"TEXTURE_BINDING_BUFFER", QUERY_BOOLEAN));
		queryGroup->addChild(new TextureBindingBufferQueryCase(context, "texture_binding_buffer_getinteger",	"TEXTURE_BINDING_BUFFER", QUERY_INTEGER));
		queryGroup->addChild(new TextureBindingBufferQueryCase(context, "texture_binding_buffer_getinteger64",	"TEXTURE_BINDING_BUFFER", QUERY_INTEGER64));
		queryGroup->addChild(new TextureBindingBufferQueryCase(context, "texture_binding_buffer_getfloat",		"TEXTURE_BINDING_BUFFER", QUERY_FLOAT));

		queryGroup->addChild(new TextureBufferDataStoreQueryCase(context, "texture_buffer_data_store_binding_integer",	"TEXTURE_BUFFER_DATA_STORE_BINDING", QUERY_TEXTURE_LEVEL_INTEGER));
		queryGroup->addChild(new TextureBufferDataStoreQueryCase(context, "texture_buffer_data_store_binding_float",	"TEXTURE_BUFFER_DATA_STORE_BINDING", QUERY_TEXTURE_LEVEL_FLOAT));

		queryGroup->addChild(new TextureBufferOffsetQueryCase(context, "texture_buffer_offset_integer",	"TEXTURE_BUFFER_OFFSET", QUERY_TEXTURE_LEVEL_INTEGER));
		queryGroup->addChild(new TextureBufferOffsetQueryCase(context, "texture_buffer_offset_float",	"TEXTURE_BUFFER_OFFSET", QUERY_TEXTURE_LEVEL_FLOAT));

		queryGroup->addChild(new TextureBufferSizeQueryCase(context, "texture_buffer_size_integer",	"TEXTURE_BUFFER_SIZE", QUERY_TEXTURE_LEVEL_INTEGER));
		queryGroup->addChild(new TextureBufferSizeQueryCase(context, "texture_buffer_size_float",	"TEXTURE_BUFFER_SIZE", QUERY_TEXTURE_LEVEL_FLOAT));
	}

	// Rendering test
	{
		TestCaseGroup* const renderGroup = new TestCaseGroup(context, "render", "Setup texture buffer with glBufferData and render data in different ways");
		root->addChild(renderGroup);

		for (int renderTypeNdx = 0; renderTypeNdx < DE_LENGTH_OF_ARRAY(renderTypeCombinations); renderTypeNdx++)
		{
			const RenderBits		renderType		= renderTypeCombinations[renderTypeNdx];
			TestCaseGroup* const	renderTypeGroup	= new TestCaseGroup(context, toTestName(renderType).c_str(), toTestName(renderType).c_str());

			renderGroup->addChild(renderTypeGroup);

			for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(bufferSizes); sizeNdx++)
			{
				const size_t size	= bufferSizes[sizeNdx];
				const string name	("buffer_size_" + de::toString(size));

				renderTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, size, 0, 0, RENDERBITS_NONE, MODIFYBITS_NONE, renderType, name.c_str(), name.c_str()));
			}

			for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(rangeSizes); sizeNdx++)
			{
				const size_t size		= rangeSizes[sizeNdx];
				const string name		("range_size_" + de::toString(size));
				const size_t bufferSize	= 131072;

				renderTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, bufferSize, 0, size, RENDERBITS_NONE, MODIFYBITS_NONE, renderType, name.c_str(), name.c_str()));
			}

			for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
			{
				const size_t offset		= offsets[offsetNdx];
				const size_t bufferSize	= 131072;
				const size_t size		= 65537;
				const string name		("offset_" + de::toString(offset) + "_alignments");

				renderTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, bufferSize, offset, size, RENDERBITS_NONE, MODIFYBITS_NONE, renderType, name.c_str(), name.c_str()));
			}
		}
	}

	// Modify tests
	{
		TestCaseGroup* const modifyGroup = new TestCaseGroup(context, "modify", "Modify texture buffer content in multiple ways");
		root->addChild(modifyGroup);

		for (int modifyNdx = 0; modifyNdx < DE_LENGTH_OF_ARRAY(modifyTypes); modifyNdx++)
		{
			const ModifyBits		modifyType		= modifyTypes[modifyNdx];
			TestCaseGroup* const	modifyTypeGroup	= new TestCaseGroup(context, toTestName(modifyType).c_str(), toTestName(modifyType).c_str());

			modifyGroup->addChild(modifyTypeGroup);

			for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(bufferSizes); sizeNdx++)
			{
				const size_t	size	= bufferSizes[sizeNdx];
				const string	name	("buffer_size_" + de::toString(size));

				modifyTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, size, 0, 0, RENDERBITS_NONE, modifyType, RENDERBITS_AS_FRAGMENT_TEXTURE, name.c_str(), name.c_str()));
			}

			for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(rangeSizes); sizeNdx++)
			{
				const size_t size		= rangeSizes[sizeNdx];
				const string name		("range_size_" + de::toString(size));
				const size_t bufferSize	= 131072;

				modifyTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, bufferSize, 0, size, RENDERBITS_NONE, modifyType, RENDERBITS_AS_FRAGMENT_TEXTURE, name.c_str(), name.c_str()));
			}

			for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
			{
				const size_t offset		= offsets[offsetNdx];
				const size_t bufferSize	= 131072;
				const size_t size		= 65537;
				const string name		("offset_" + de::toString(offset) + "_alignments");

				modifyTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, bufferSize, offset, size, RENDERBITS_NONE, modifyType, RENDERBITS_AS_FRAGMENT_TEXTURE, name.c_str(), name.c_str()));
			}
		}
	}

	// Modify-Render tests
	{
		TestCaseGroup* const modifyRenderGroup = new TestCaseGroup(context, "modify_render", "Modify texture buffer content in multiple ways and render in different ways");
		root->addChild(modifyRenderGroup);

		for (int modifyNdx = 0; modifyNdx < DE_LENGTH_OF_ARRAY(modifyTypes); modifyNdx++)
		{
			const ModifyBits		modifyType		= modifyTypes[modifyNdx];
			TestCaseGroup* const	modifyTypeGroup	= new TestCaseGroup(context, toTestName(modifyType).c_str(), toTestName(modifyType).c_str());

			modifyRenderGroup->addChild(modifyTypeGroup);

			for (int renderTypeNdx = 0; renderTypeNdx < DE_LENGTH_OF_ARRAY(renderTypeCombinations); renderTypeNdx++)
			{
				const RenderBits	renderType	= renderTypeCombinations[renderTypeNdx];
				const size_t		size		= 16*1024;
				const string		name		(toTestName(renderType));

				modifyTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, size, 0, 0, RENDERBITS_NONE, modifyType, renderType, name.c_str(), name.c_str()));
			}
		}
	}

	// Render-Modify tests
	{
		TestCaseGroup* const renderModifyGroup = new TestCaseGroup(context, "render_modify", "Render texture buffer and modify.");
		root->addChild(renderModifyGroup);

		for (int renderTypeNdx = 0; renderTypeNdx < DE_LENGTH_OF_ARRAY(renderTypeCombinations); renderTypeNdx++)
		{
			const RenderBits		renderType		= renderTypeCombinations[renderTypeNdx];
			TestCaseGroup* const	renderTypeGroup	= new TestCaseGroup(context, toTestName(renderType).c_str(), toTestName(renderType).c_str());

			renderModifyGroup->addChild(renderTypeGroup);

			for (int modifyNdx = 0; modifyNdx < DE_LENGTH_OF_ARRAY(modifyTypes); modifyNdx++)
			{
				const ModifyBits	modifyType	= modifyTypes[modifyNdx];
				const size_t		size		= 16*1024;
				const string		name		(toTestName(modifyType));

				renderTypeGroup->addChild(new TextureBufferCase(context.getTestContext(), context.getRenderContext(), GL_RGBA8, size, 0, 0, renderType, modifyType, RENDERBITS_AS_FRAGMENT_TEXTURE, name.c_str(), name.c_str()));
			}
		}
	}

	return root;
}